

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

int __thiscall
Centaurus::LookaheadDFA<wchar_t>::add_state(LookaheadDFA<wchar_t> *this,CATNClosure *label)

{
  bool bVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  ulong uVar5;
  
  pLVar2 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 != pLVar2) {
    uVar5 = 0;
    do {
      if ((label->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
          pLVar2[uVar5].
          super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
          .m_label._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        bVar1 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>,std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>>
                          ((label->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           (_Rb_tree_const_iterator<Centaurus::CATNClosureElement>)
                           &(label->_M_t)._M_impl.super__Rb_tree_header,
                           pLVar2[uVar5].
                           super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                           .m_label._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
        if (bVar1) goto LAB_001425a1;
        pLVar2 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar3 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      uVar4 = ((long)pLVar3 - (long)pLVar2 >> 4) * -0x3333333333333333;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  std::vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>>::
  emplace_back<std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>const&>
            ((vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>> *)
             &(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,label);
  uVar5 = (ulong)((int)((ulong)((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states
                                      .
                                      super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                                     super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333
                 - 1);
LAB_001425a1:
  return (int)uVar5;
}

Assistant:

int add_state(const CATNClosure& label)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label == m_states[i].label())
			{
				return i;
			}
		}
		m_states.emplace_back(label);
		return m_states.size() - 1;
	}